

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking.c
# Opt level: O2

_Bool blocking_tcp_connect(char *host,int port,int *fd)

{
  int __fd;
  int iVar1;
  uint uVar2;
  char *__s;
  sockaddr_in addr;
  
  __fd = socket(2,1,0);
  if (__fd != -1) {
    inet_pton(2,host,&addr.sin_addr);
    addr.sin_family = 2;
    addr.sin_port = (ushort)port << 8 | (ushort)port >> 8;
    iVar1 = connect(__fd,(sockaddr *)&addr,0x10);
    if (iVar1 == -1) {
      __s = "connect()";
    }
    else {
      uVar2 = fcntl(__fd,3,0);
      iVar1 = fcntl(__fd,4,(ulong)(uVar2 | 0x800));
      if (iVar1 != -1) {
        *fd = __fd;
        return true;
      }
      __s = "fcntl()";
    }
    perror(__s);
    close(__fd);
  }
  return false;
}

Assistant:

bool blocking_tcp_connect(const char * host, int port, int * fd)
{
  int sockfd = socket(AF_INET, SOCK_STREAM, 0);
  if(sockfd == -1) return false;
  
 
  struct sockaddr_in addr;

  inet_pton(AF_INET, host, &addr.sin_addr);
  addr.sin_family = AF_INET;
  addr.sin_port = htons(port);
  
  if( connect(sockfd, (struct sockaddr *)&addr, sizeof(struct sockaddr_in)) == -1)
  {
    perror("connect()");
    close(sockfd);
    return false;
  }
  if(fcntl(sockfd, F_SETFL, fcntl(sockfd, F_GETFL, 0) | O_NONBLOCK) == -1)
  {
    perror("fcntl()");
    close(sockfd);
    return false;
  }
  *fd = sockfd;
  return true;
}